

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

void __thiscall
pbrt::KdTreeAggregate::buildTree
          (KdTreeAggregate *this,int nodeNum,Bounds3f *nodeBounds,
          vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *allPrimBounds,
          int *primNums,int nPrimitives,int depth,
          unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *edges,int *prims0,
          int *prims1,int badRefines)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  pointer pBVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  KdTreeNode *__src;
  pointer pBVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  KdTreeNode *pKVar17;
  EdgeType *pEVar18;
  Point3<float> *pPVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int *piVar23;
  int iVar24;
  ulong uVar25;
  Bounds3f *pBVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  BoundEdge *pBVar34;
  BoundEdge *__i;
  BoundEdge *pBVar35;
  ulong uVar36;
  ulong uVar37;
  BoundEdge *pBVar38;
  int *piVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  undefined1 in_ZMM11 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM20 [16];
  ulong local_110;
  Bounds3f bounds1;
  Bounds3f bounds0;
  
  bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)nodeNum;
  bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)this->nextFreeNode;
  if (this->nextFreeNode != nodeNum) {
    LogFatal<char_const(&)[8],char_const(&)[13],char_const(&)[8],int&,char_const(&)[13],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
               ,0x365,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [8])"nodeNum",
               (char (*) [13])"nextFreeNode",(char (*) [8])"nodeNum",(int *)&bounds0,
               (char (*) [13])"nextFreeNode",(int *)&bounds1);
  }
  iVar21 = nodeNum;
  if (this->nAllocedNodes == nodeNum) {
    uVar25 = 0x200;
    if (0x200 < nodeNum * 2) {
      uVar25 = (ulong)(uint)(nodeNum * 2);
    }
    pKVar17 = (KdTreeNode *)operator_new__(uVar25 * 8);
    if (0 < nodeNum) {
      __src = this->nodes;
      memcpy(pKVar17,__src,(ulong)(uint)nodeNum << 3);
      if (__src != (KdTreeNode *)0x0) {
        operator_delete__(__src);
        iVar21 = this->nextFreeNode;
      }
    }
    this->nodes = pKVar17;
    this->nAllocedNodes = (int)uVar25;
  }
  this->nextFreeNode = iVar21 + 1;
  if ((depth != 0) && (this->maxPrims < nPrimitives)) {
    uVar7 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    uVar9 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
    auVar46._4_4_ = uVar9;
    auVar46._0_4_ = uVar7;
    auVar46._8_8_ = 0;
    uVar8 = (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    uVar10 = (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
    auVar41._4_4_ = uVar10;
    auVar41._0_4_ = uVar8;
    auVar41._8_8_ = 0;
    uVar16 = nPrimitives * 2;
    fVar48 = (float)(this->isectCost * nPrimitives);
    auVar41 = vsubps_avx(auVar46,auVar41);
    fVar44 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.x -
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
    pfVar1 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
    pfVar2 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
    auVar46 = vmovshdup_avx(auVar41);
    pfVar3 = &(nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
    pfVar4 = &(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
    auVar45 = ZEXT416((uint)fVar44);
    uVar25 = vcmpps_avx512vl(auVar41,auVar45,1);
    uVar22 = vcmpps_avx512vl(auVar46,auVar45,1);
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * auVar46._0_4_)),auVar41,auVar45);
    uVar37 = (ulong)((auVar41._0_4_ <= auVar46._0_4_) + 1);
    if ((uVar25 & uVar22 & 1) != 0) {
      uVar37 = 0;
    }
    auVar46 = vfmadd231ss_fma(auVar45,auVar41,auVar46);
    iVar21 = 0;
    uVar25 = 1;
    if (1 < (int)uVar16) {
      uVar25 = (ulong)uVar16;
    }
    local_110 = 0xffffffff;
    do {
      iVar24 = (int)uVar37;
      if (nPrimitives < 1) {
        pBVar38 = edges[uVar37]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
      }
      else {
        uVar22 = 0;
        pBVar11 = (allPrimBounds->
                  super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          iVar27 = primNums[uVar22];
          pBVar5 = pBVar11 + iVar27;
          if (iVar24 == 1) {
            fVar44 = (pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.y;
            pBVar38 = edges[uVar37]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
            pBVar34 = pBVar38 + uVar22 * 2;
            lVar32 = 0x10;
          }
          else if (iVar24 == 0) {
            fVar44 = (pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.x;
            pBVar38 = edges[uVar37]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
            pBVar34 = pBVar38 + uVar22 * 2;
            lVar32 = 0xc;
          }
          else {
            fVar44 = (pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.z;
            pBVar38 = edges[uVar37]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
            pBVar34 = pBVar38 + uVar22 * 2;
            lVar32 = 0x14;
          }
          pBVar34->t = fVar44;
          pBVar34->primNum = iVar27;
          pBVar34->type = Start;
          uVar29 = (int)uVar22 * 2 | 1;
          uVar22 = uVar22 + 1;
          pBVar38[uVar29].t =
               *(Float *)((long)&(pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.x + lVar32);
          pBVar38[uVar29].primNum = iVar27;
          pBVar38[uVar29].type = End;
        } while (uVar22 != (uint)nPrimitives);
      }
      uVar29 = 0xffffffff;
      if (nPrimitives == 0) {
        iVar27 = 0;
        bVar40 = true;
      }
      else {
        pBVar34 = pBVar38 + (int)uVar16;
        std::
        __introsort_loop<pbrt::BoundEdge*,long,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                  (pBVar38,pBVar34,(int)LZCOUNT((long)(int)uVar16) * 2 ^ 0x7e);
        if (nPrimitives < 9) {
          std::
          __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    (pBVar38,pBVar34);
        }
        else {
          pBVar35 = pBVar38 + 0x10;
          std::
          __insertion_sort<pbrt::BoundEdge*,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>>
                    (pBVar38,pBVar35);
          piVar39 = &pBVar38[0x10].primNum;
          do {
            fVar44 = pBVar35->t;
            uVar12._0_4_ = pBVar35->primNum;
            uVar12._4_4_ = pBVar35->type;
            for (piVar23 = piVar39;
                (fVar44 < (float)piVar23[-4] ||
                ((fVar44 <= (float)piVar23[-4] && ((int)uVar12._4_4_ < piVar23[-2]))));
                piVar23 = piVar23 + -3) {
              piVar23[1] = piVar23[-2];
              uVar13 = *(undefined8 *)(piVar23 + -4);
              ((BoundEdge *)(piVar23 + -1))->t = (Float)(int)uVar13;
              ((BoundEdge *)(piVar23 + -1))->primNum = (int)((ulong)uVar13 >> 0x20);
            }
            pBVar35 = pBVar35 + 1;
            piVar39 = piVar39 + 3;
            ((BoundEdge *)(piVar23 + -1))->t = fVar44;
            *(undefined8 *)piVar23 = uVar12;
          } while (pBVar35 != pBVar34);
        }
        uVar29 = 0xffffffff;
        if (nPrimitives < 1) {
          bVar40 = false;
          iVar27 = 0;
        }
        else {
          uVar36 = 0xffffffff;
          iVar27 = 0;
          pEVar18 = &(edges[uVar37]._M_t.
                      super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                      .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl)->type;
          fVar44 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.x -
                   (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
          fVar14 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y -
                   (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
          fVar15 = (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z -
                   (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
          auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)this->emptyBonus));
          iVar20 = iVar24 + 1 + ((iVar24 + 1U) / 3) * -3;
          iVar28 = iVar24 + 2 + ((iVar24 + 2U) / 3) * -3;
          auVar45._0_4_ = (float)this->traversalCost;
          auVar45._4_12_ = in_ZMM11._4_12_;
          uVar30 = 0;
          uVar22 = (ulong)(uint)nPrimitives;
          do {
            pBVar26 = nodeBounds;
            if ((iVar24 != 0) && (pBVar26 = (Bounds3f *)pfVar2, iVar24 != 1)) {
              pBVar26 = (Bounds3f *)pfVar4;
            }
            fVar6 = ((BoundEdge *)(pEVar18 + -2))->t;
            uVar31 = (int)uVar22 - (uint)(*pEVar18 == End);
            uVar22 = (ulong)uVar31;
            if ((pBVar26->pMin).super_Tuple3<pbrt::Point3,_float>.x < fVar6) {
              pPVar19 = &nodeBounds->pMax;
              if ((iVar24 != 0) && (pPVar19 = (Point3<float> *)pfVar1, iVar24 != 1)) {
                pPVar19 = (Point3<float> *)pfVar3;
              }
              if (fVar6 < (pPVar19->super_Tuple3<pbrt::Point3,_float>).x) {
                auVar47 = ZEXT416((uint)fVar14);
                auVar42 = ZEXT416((uint)fVar15);
                auVar49 = ZEXT416((uint)fVar44);
                if ((iVar20 != 0) && (auVar49 = auVar47, iVar20 != 1)) {
                  auVar49 = auVar42;
                }
                auVar43 = ZEXT416((uint)fVar44);
                if ((iVar28 != 0) && (auVar43 = auVar47, iVar28 != 1)) {
                  auVar43 = auVar42;
                }
                pBVar26 = nodeBounds;
                if ((iVar24 != 0) && (pBVar26 = (Bounds3f *)pfVar2, iVar24 != 1)) {
                  pBVar26 = (Bounds3f *)pfVar4;
                }
                fVar50 = fVar44;
                if ((iVar20 != 0) && (fVar50 = fVar14, iVar20 != 1)) {
                  fVar50 = fVar15;
                }
                fVar51 = fVar44;
                if ((iVar28 != 0) && (fVar51 = fVar14, iVar28 != 1)) {
                  fVar51 = fVar15;
                }
                in_ZMM11 = ZEXT1664(ZEXT416((uint)fVar44));
                if ((iVar20 != 0) && (in_ZMM11 = ZEXT1664(auVar47), iVar20 != 1)) {
                  in_ZMM11 = ZEXT1664(auVar42);
                }
                auVar54 = ZEXT416((uint)fVar44);
                if ((iVar28 != 0) && (auVar54 = auVar47, iVar28 != 1)) {
                  auVar54 = auVar42;
                }
                pPVar19 = &nodeBounds->pMax;
                if ((iVar24 != 0) && (pPVar19 = (Point3<float> *)pfVar1, iVar24 != 1)) {
                  pPVar19 = (Point3<float> *)pfVar3;
                }
                auVar52 = ZEXT416((uint)fVar44);
                if ((iVar20 != 0) && (auVar52 = auVar47, iVar20 != 1)) {
                  auVar52 = auVar42;
                }
                auVar53 = ZEXT416((uint)fVar44);
                if ((iVar28 != 0) && (auVar53 = auVar47, iVar28 != 1)) {
                  auVar53 = auVar42;
                }
                auVar42 = vaddss_avx512f(auVar52,auVar53);
                auVar47 = vcvtsi2ss_avx512f(in_XMM20,uVar31);
                bVar40 = iVar27 == 0;
                auVar42 = vfmadd213ss_fma(auVar54,in_ZMM11._0_16_,
                                          ZEXT416((uint)(auVar42._0_4_ *
                                                        ((pPVar19->super_Tuple3<pbrt::Point3,_float>
                                                         ).x - fVar6))));
                auVar43 = vfmadd213ss_fma(auVar43,auVar49,
                                          ZEXT416((uint)((fVar6 - (pBVar26->pMin).
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  x) * (fVar50 + fVar51))));
                auVar49 = vcvtsi2ss_avx512f(in_XMM20,iVar27);
                auVar54 = ZEXT416((uint)(1.0 / (auVar46._0_4_ + auVar46._0_4_)));
                auVar42 = vmulss_avx512f(auVar54,ZEXT416((uint)(auVar42._0_4_ + auVar42._0_4_)));
                auVar43 = vmulss_avx512f(auVar54,ZEXT416((uint)(auVar43._0_4_ + auVar43._0_4_)));
                auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar42._0_4_)),auVar43,
                                          auVar49);
                auVar47 = vfmadd213ss_fma(auVar49,ZEXT416((uint)((float)((uint)(uVar31 == 0) *
                                                                         auVar41._0_4_ +
                                                                        (uint)(uVar31 != 0) *
                                                                        ((uint)bVar40 *
                                                                         auVar41._0_4_ +
                                                                        (uint)!bVar40 * 0x3f800000))
                                                                * (float)this->isectCost)),auVar45);
                auVar49 = vucomiss_avx512f(auVar47);
                vminss_avx512f(auVar47,auVar49);
                if (!bVar40) {
                  local_110 = uVar30;
                }
                local_110 = local_110 & 0xffffffff;
                if (!bVar40) {
                  uVar36 = uVar37;
                }
              }
            }
            uVar29 = (uint)uVar36;
            iVar27 = iVar27 + (uint)(*pEVar18 == Start);
            uVar30 = uVar30 + 1;
            pEVar18 = pEVar18 + 3;
          } while (uVar25 != uVar30);
          bVar40 = uVar31 == 0;
        }
      }
      if ((iVar27 != nPrimitives) || (!bVar40)) {
        LogFatal<char_const(&)[37]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                   ,0x3b1,"Check failed: %s",(char (*) [37])"nBelow == nPrimitives && nAbove == 0");
      }
      bVar40 = 1 < iVar21;
      if (bVar40 || uVar29 != 0xffffffff) {
        vucomiss_avx512f(ZEXT416((uint)fVar48));
        vucomiss_avx512f(ZEXT416((uint)(fVar48 * 4.0)));
        if ((uVar29 == 0xffffffff) || (badRefines == 3)) break;
        iVar27 = 0;
        iVar20 = 0;
        iVar24 = (int)local_110;
        if (0 < iVar24) {
          pBVar38 = edges[(int)uVar29]._M_t.
                    super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                    .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
          iVar27 = 0;
          lVar32 = 0;
          do {
            if (*(int *)((long)&pBVar38->type + lVar32) == 0) {
              lVar33 = (long)iVar27;
              iVar27 = iVar27 + 1;
              prims0[lVar33] = *(int *)((long)&pBVar38->primNum + lVar32);
            }
            lVar32 = lVar32 + 0xc;
          } while (local_110 * 0xc != lVar32);
        }
        pBVar38 = edges[(int)uVar29]._M_t.
                  super___uniq_ptr_impl<pbrt::BoundEdge,_std::default_delete<pbrt::BoundEdge[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_pbrt::BoundEdge_*,_std::default_delete<pbrt::BoundEdge[]>_>
                  .super__Head_base<0UL,_pbrt::BoundEdge_*,_false>._M_head_impl;
        if (iVar24 + 1 < (int)uVar16) {
          iVar20 = 0;
          pEVar18 = &pBVar38[iVar24 + 1].type;
          iVar28 = nPrimitives * -2 + 1 + iVar24;
          do {
            if (*pEVar18 == End) {
              lVar32 = (long)iVar20;
              iVar20 = iVar20 + 1;
              prims1[lVar32] = pEVar18[-1];
            }
            pEVar18 = pEVar18 + 3;
            iVar28 = iVar28 + 1;
          } while (iVar28 != 0);
        }
        fVar44 = pBVar38[iVar24].t;
        bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
        bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
        bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        bounds0.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        bounds0._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
        bounds1.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (nodeBounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
        bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
        bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
        bounds1._8_8_ = *(undefined8 *)&(nodeBounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
        if (uVar29 == 1) {
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar44;
          pPVar19 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        }
        else if (uVar29 == 0) {
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar44;
          pPVar19 = &bounds0.pMax;
        }
        else {
          pPVar19 = (Point3<float> *)&bounds0.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          bounds1.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar44;
        }
        (pPVar19->super_Tuple3<pbrt::Point3,_float>).x = fVar44;
        buildTree(this,nodeNum + 1,&bounds0,allPrimBounds,prims0,iVar27,depth + -1,edges,prims0,
                  prims1 + nPrimitives,badRefines);
        iVar24 = this->nextFreeNode;
        pKVar17 = this->nodes;
        pKVar17[nodeNum].field_0.onePrimitive = (int)fVar44;
        pKVar17[nodeNum].field_1.flags = iVar24 * 4 | uVar29;
        buildTree(this,iVar24,&bounds1,allPrimBounds,prims1,iVar20,depth + -1,edges,prims0,
                  prims1 + nPrimitives,badRefines);
      }
      else {
        iVar21 = iVar21 + 1;
        uVar37 = (ulong)((iVar24 + 1U) % 3);
      }
      if (bVar40 || uVar29 != 0xffffffff) {
        return;
      }
    } while( true );
  }
  KdTreeNode::InitLeaf(this->nodes + nodeNum,primNums,nPrimitives,&this->primitiveIndices);
  return;
}

Assistant:

void KdTreeAggregate::buildTree(int nodeNum, const Bounds3f &nodeBounds,
                                const std::vector<Bounds3f> &allPrimBounds, int *primNums,
                                int nPrimitives, int depth,
                                const std::unique_ptr<BoundEdge[]> edges[3], int *prims0,
                                int *prims1, int badRefines) {
    CHECK_EQ(nodeNum, nextFreeNode);
    // Get next free node from _nodes_ array
    if (nextFreeNode == nAllocedNodes) {
        int nNewAllocNodes = std::max(2 * nAllocedNodes, 512);
        KdTreeNode *n = new KdTreeNode[nNewAllocNodes];
        if (nAllocedNodes > 0) {
            memcpy(n, nodes, nAllocedNodes * sizeof(KdTreeNode));
            delete[] nodes;
        }
        nodes = n;
        nAllocedNodes = nNewAllocNodes;
    }
    ++nextFreeNode;

    // Initialize leaf node if termination criteria met
    if (nPrimitives <= maxPrims || depth == 0) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Initialize interior node and continue recursion
    // Choose split axis position for interior node
    int bestAxis = -1, bestOffset = -1;
    Float bestCost = Infinity, leafCost = isectCost * nPrimitives;
    Float invTotalSA = 1 / nodeBounds.SurfaceArea();
    // Choose which axis to split along
    int axis = nodeBounds.MaxDimension();

    // Choose split along axis and attempt to partition primitives
    int retries = 0;
retrySplit:
    // Initialize edges for _axis_
    for (int i = 0; i < nPrimitives; ++i) {
        int pn = primNums[i];
        const Bounds3f &bounds = allPrimBounds[pn];
        edges[axis][2 * i] = BoundEdge(bounds.pMin[axis], pn, true);
        edges[axis][2 * i + 1] = BoundEdge(bounds.pMax[axis], pn, false);
    }
    // Sort _edges_ for _axis_
    std::sort(&edges[axis][0], &edges[axis][2 * nPrimitives],
              [](const BoundEdge &e0, const BoundEdge &e1) -> bool {
                  return std::tie(e0.t, e0.type) < std::tie(e1.t, e1.type);
              });

    // Compute cost of all splits for _axis_ to find best
    int nBelow = 0, nAbove = nPrimitives;
    for (int i = 0; i < 2 * nPrimitives; ++i) {
        if (edges[axis][i].type == EdgeType::End)
            --nAbove;
        Float edgeT = edges[axis][i].t;
        if (edgeT > nodeBounds.pMin[axis] && edgeT < nodeBounds.pMax[axis]) {
            // Compute child surface areas for split at _edgeT_
            Vector3f d = nodeBounds.pMax - nodeBounds.pMin;
            int otherAxis0 = (axis + 1) % 3, otherAxis1 = (axis + 2) % 3;
            Float belowSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (edgeT - nodeBounds.pMin[axis]) * (d[otherAxis0] + d[otherAxis1]));
            Float aboveSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (nodeBounds.pMax[axis] - edgeT) * (d[otherAxis0] + d[otherAxis1]));

            // Compute cost for split at _i_th edge
            Float pBelow = belowSA * invTotalSA, pAbove = aboveSA * invTotalSA;
            Float eb = (nAbove == 0 || nBelow == 0) ? emptyBonus : 0;
            Float cost = traversalCost +
                         isectCost * (1 - eb) * (pBelow * nBelow + pAbove * nAbove);
            // Update best split if this is lowest cost so far
            if (cost < bestCost) {
                bestCost = cost;
                bestAxis = axis;
                bestOffset = i;
            }
        }
        if (edges[axis][i].type == EdgeType::Start)
            ++nBelow;
    }
    CHECK(nBelow == nPrimitives && nAbove == 0);

    // Create leaf if no good splits were found
    if (bestAxis == -1 && retries < 2) {
        ++retries;
        axis = (axis + 1) % 3;
        goto retrySplit;
    }
    if (bestCost > leafCost)
        ++badRefines;
    if ((bestCost > 4 * leafCost && nPrimitives < 16) || bestAxis == -1 ||
        badRefines == 3) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Classify primitives with respect to split
    int n0 = 0, n1 = 0;
    for (int i = 0; i < bestOffset; ++i)
        if (edges[bestAxis][i].type == EdgeType::Start)
            prims0[n0++] = edges[bestAxis][i].primNum;
    for (int i = bestOffset + 1; i < 2 * nPrimitives; ++i)
        if (edges[bestAxis][i].type == EdgeType::End)
            prims1[n1++] = edges[bestAxis][i].primNum;

    // Recursively initialize children nodes
    Float tSplit = edges[bestAxis][bestOffset].t;
    Bounds3f bounds0 = nodeBounds, bounds1 = nodeBounds;
    bounds0.pMax[bestAxis] = bounds1.pMin[bestAxis] = tSplit;
    buildTree(nodeNum + 1, bounds0, allPrimBounds, prims0, n0, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
    int aboveChild = nextFreeNode;
    nodes[nodeNum].InitInterior(bestAxis, aboveChild, tSplit);
    buildTree(aboveChild, bounds1, allPrimBounds, prims1, n1, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
}